

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

void __thiscall cmCTest::StartXML(cmCTest *this,cmXMLWriter *xml,bool append)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined8 *puVar8;
  long *plVar9;
  size_type *psVar10;
  undefined8 uVar11;
  SystemInformation info;
  string changeId;
  string site;
  string stamp;
  string buildname;
  SystemInformation local_230;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  if ((this->CurrentTag)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Current Tag empty, this may mean NightlStartTime was not set correctly.",0x47);
    std::ios::widen((char)local_1a8 + (char)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x539,local_1c8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    cmSystemTools::s_FatalErrorOccured = true;
  }
  cmsys::SystemInformation::SystemInformation(&local_230);
  cmsys::SystemInformation::RunCPUCheck(&local_230);
  cmsys::SystemInformation::RunOSCheck(&local_230);
  cmsys::SystemInformation::RunMemoryCheck(&local_230);
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"BuildName","");
  GetCTestConfiguration(&local_1c8,this,&local_1e8);
  SafeBuildIdField(local_1a8,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_228.field_2;
  pcVar4 = (this->CurrentTag)._M_dataplus._M_p;
  local_228._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,pcVar4,pcVar4 + (this->CurrentTag)._M_string_length);
  std::__cxx11::string::append((char *)&local_228);
  GetTestModelString_abi_cxx11_(&local_208,this);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    uVar11 = local_228.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_208._M_string_length + local_228._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      uVar11 = local_208.field_2._M_allocated_capacity;
    }
    if (local_208._M_string_length + local_228._M_string_length <= (ulong)uVar11) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_208,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
      goto LAB_001507e2;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_208._M_dataplus._M_p);
LAB_001507e2:
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1e8.field_2._M_allocated_capacity = *psVar10;
    local_1e8.field_2._8_8_ = puVar8[3];
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar10;
    local_1e8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_1e8._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)psVar10 = 0;
  SafeBuildIdField(&local_1c8,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar3) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Site","");
  GetCTestConfiguration(&local_228,this,&local_208);
  SafeBuildIdField(&local_1e8,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar3) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::StartDocument(xml,"UTF-8");
  local_228._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Site","");
  cmXMLWriter::StartElement(xml,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildName",local_1a8);
  cmXMLWriter::BreakAttributes(xml);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildStamp",&local_1c8);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Name",&local_1e8);
  local_208._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"ctest-","");
  cmVersion::GetCMakeVersion();
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
  psVar10 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228.field_2._8_8_ = plVar9[3];
    local_228._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_228._M_string_length = plVar9[1];
  *plVar9 = (long)psVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Generator",&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar3) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (append) {
    cmXMLWriter::Attribute<char[5]>(xml,"Append",(char (*) [5])0x599896);
  }
  local_208._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Compiler","");
  GetCTestConfiguration(&local_228,this,&local_208);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"CompilerName",&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar3) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"CompilerVersion","");
  GetCTestConfiguration(&local_228,this,&local_208);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"CompilerVersion",&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar3) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_228._M_dataplus._M_p = cmsys::SystemInformation::GetOSName(&local_230);
  cmXMLWriter::Attribute<char_const*>(xml,"OSName",(char **)&local_228);
  local_228._M_dataplus._M_p = cmsys::SystemInformation::GetHostname(&local_230);
  cmXMLWriter::Attribute<char_const*>(xml,"Hostname",(char **)&local_228);
  local_228._M_dataplus._M_p = cmsys::SystemInformation::GetOSRelease(&local_230);
  cmXMLWriter::Attribute<char_const*>(xml,"OSRelease",(char **)&local_228);
  local_228._M_dataplus._M_p = cmsys::SystemInformation::GetOSVersion(&local_230);
  cmXMLWriter::Attribute<char_const*>(xml,"OSVersion",(char **)&local_228);
  local_228._M_dataplus._M_p = cmsys::SystemInformation::GetOSPlatform(&local_230);
  cmXMLWriter::Attribute<char_const*>(xml,"OSPlatform",(char **)&local_228);
  bVar5 = cmsys::SystemInformation::Is64Bits(&local_230);
  local_228._M_dataplus._M_p._0_1_ = bVar5;
  cmXMLWriter::Attribute<bool>(xml,"Is64Bits",(bool *)&local_228);
  local_228._M_dataplus._M_p = cmsys::SystemInformation::GetVendorString(&local_230);
  cmXMLWriter::Attribute<char_const*>(xml,"VendorString",(char **)&local_228);
  local_228._M_dataplus._M_p = cmsys::SystemInformation::GetVendorID(&local_230);
  cmXMLWriter::Attribute<char_const*>(xml,"VendorID",(char **)&local_228);
  cmsys::SystemInformation::GetFamilyID_abi_cxx11_(&local_228,&local_230);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"FamilyID",&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemInformation::GetModelID_abi_cxx11_(&local_228,&local_230);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"ModelID",&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  iVar6 = cmsys::SystemInformation::GetProcessorCacheSize(&local_230);
  local_228._M_dataplus._M_p._0_4_ = (float)iVar6;
  cmXMLWriter::Attribute<int>(xml,"ProcessorCacheSize",(int *)&local_228);
  local_228._M_dataplus._M_p._0_4_ =
       (float)cmsys::SystemInformation::GetNumberOfLogicalCPU(&local_230);
  cmXMLWriter::Attribute<unsigned_int>(xml,"NumberOfLogicalCPU",(uint *)&local_228);
  local_228._M_dataplus._M_p._0_4_ =
       (float)cmsys::SystemInformation::GetNumberOfPhysicalCPU(&local_230);
  cmXMLWriter::Attribute<unsigned_int>(xml,"NumberOfPhysicalCPU",(uint *)&local_228);
  local_228._M_dataplus._M_p = (pointer)cmsys::SystemInformation::GetTotalVirtualMemory(&local_230);
  cmXMLWriter::Attribute<unsigned_long>(xml,"TotalVirtualMemory",(unsigned_long *)&local_228);
  local_228._M_dataplus._M_p = (pointer)cmsys::SystemInformation::GetTotalPhysicalMemory(&local_230)
  ;
  cmXMLWriter::Attribute<unsigned_long>(xml,"TotalPhysicalMemory",(unsigned_long *)&local_228);
  uVar7 = cmsys::SystemInformation::GetLogicalProcessorsPerPhysical(&local_230);
  local_228._M_dataplus._M_p._0_4_ = (float)uVar7;
  cmXMLWriter::Attribute<unsigned_int>(xml,"LogicalProcessorsPerPhysical",(uint *)&local_228);
  local_228._M_dataplus._M_p._0_4_ =
       cmsys::SystemInformation::GetProcessorClockFrequency(&local_230);
  cmXMLWriter::Attribute<float>(xml,"ProcessorClockFrequency",(float *)&local_228);
  local_208._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"ChangeId","");
  GetCTestConfiguration(&local_228,this,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar3) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_228._M_string_length != 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"ChangeId",&local_228);
  }
  AddSiteProperties(this,xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemInformation::~SystemInformation(&local_230);
  return;
}

Assistant:

void cmCTest::StartXML(cmXMLWriter& xml, bool append)
{
  if (this->CurrentTag.empty()) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Current Tag empty, this may mean"
               " NightlStartTime was not set correctly."
                 << std::endl);
    cmSystemTools::SetFatalErrorOccured();
  }

  // find out about the system
  cmsys::SystemInformation info;
  info.RunCPUCheck();
  info.RunOSCheck();
  info.RunMemoryCheck();

  std::string buildname =
    cmCTest::SafeBuildIdField(this->GetCTestConfiguration("BuildName"));
  std::string stamp = cmCTest::SafeBuildIdField(this->CurrentTag + "-" +
                                                this->GetTestModelString());
  std::string site =
    cmCTest::SafeBuildIdField(this->GetCTestConfiguration("Site"));

  xml.StartDocument();
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.BreakAttributes();
  xml.Attribute("BuildStamp", stamp);
  xml.Attribute("Name", site);
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  if (append) {
    xml.Attribute("Append", "true");
  }
  xml.Attribute("CompilerName", this->GetCTestConfiguration("Compiler"));
  xml.Attribute("CompilerVersion",
                this->GetCTestConfiguration("CompilerVersion"));
  xml.Attribute("OSName", info.GetOSName());
  xml.Attribute("Hostname", info.GetHostname());
  xml.Attribute("OSRelease", info.GetOSRelease());
  xml.Attribute("OSVersion", info.GetOSVersion());
  xml.Attribute("OSPlatform", info.GetOSPlatform());
  xml.Attribute("Is64Bits", info.Is64Bits());
  xml.Attribute("VendorString", info.GetVendorString());
  xml.Attribute("VendorID", info.GetVendorID());
  xml.Attribute("FamilyID", info.GetFamilyID());
  xml.Attribute("ModelID", info.GetModelID());
  xml.Attribute("ProcessorCacheSize", info.GetProcessorCacheSize());
  xml.Attribute("NumberOfLogicalCPU", info.GetNumberOfLogicalCPU());
  xml.Attribute("NumberOfPhysicalCPU", info.GetNumberOfPhysicalCPU());
  xml.Attribute("TotalVirtualMemory", info.GetTotalVirtualMemory());
  xml.Attribute("TotalPhysicalMemory", info.GetTotalPhysicalMemory());
  xml.Attribute("LogicalProcessorsPerPhysical",
                info.GetLogicalProcessorsPerPhysical());
  xml.Attribute("ProcessorClockFrequency", info.GetProcessorClockFrequency());

  std::string changeId = this->GetCTestConfiguration("ChangeId");
  if (!changeId.empty()) {
    xml.Attribute("ChangeId", changeId);
  }

  this->AddSiteProperties(xml);
}